

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grid.cpp
# Opt level: O1

void __thiscall
Nova::Grid<float,_2>::Nodes_In_Cell_From_Minimum_Corner_Node
          (Grid<float,_2> *this,T_INDEX *minimum_corner_node,T_INDEX *nodes)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  T_STORAGE *pTVar8;
  T_STORAGE local_68;
  T_STORAGE local_60 [2];
  int iStack_4c;
  int local_48 [6];
  Vector<int,_2,_true> data_copy;
  Range_Iterator<2,_Nova::Vector<int,_2,_true>_> iterator;
  
  lVar2 = 0;
  do {
    *(undefined4 *)((long)local_68._M_elems + lVar2) = 1;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 8);
  local_60[0]._M_elems[0] = 0;
  local_60[0]._M_elems[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  lVar2 = 2;
  do {
    local_48[lVar2] = (uint)(local_68._M_elems[lVar2] < local_60[0]._M_elems[lVar2]) * 2 + -1;
    lVar2 = lVar2 + 1;
  } while (lVar2 == 3);
  local_48[4] = 0;
  local_48[5] = 0;
  iVar3 = local_68._M_elems[0] * local_48[2];
  if (-1 < iVar3) {
    iStack_4c = 0;
    lVar2 = 0;
    local_48[5] = 0;
    iVar6 = 0;
    do {
      local_60[0]._M_elems = *&(minimum_corner_node->_data)._M_elems;
      lVar7 = 0;
      do {
        piVar1 = (int *)((long)local_60[0]._M_elems + lVar7);
        *piVar1 = *piVar1 + *(int *)((long)(&data_copy)[-1]._data._M_elems + lVar7);
        lVar7 = lVar7 + 4;
      } while (lVar7 != 8);
      *&nodes[lVar2]._data._M_elems = local_60[0]._M_elems;
      pTVar8 = &local_68;
      iVar4 = local_48[3];
      iVar5 = local_48[5];
      if (local_68._M_elems[1] * local_48[3] <= local_48[3] * local_48[5]) {
        pTVar8 = local_60;
        local_48[5] = iStack_4c;
        iVar4 = local_48[2];
        iVar5 = iVar6;
      }
      lVar2 = lVar2 + 1;
      local_68._M_elems[0] = local_48[5];
      local_60[0]._M_elems[0] = iVar6;
      pTVar8->_M_elems[0] = iVar4 + iVar5;
      local_48[5] = local_68._M_elems[0];
      local_48[4] = local_60[0]._M_elems[0];
      iVar6 = local_60[0]._M_elems[0];
    } while (local_60[0]._M_elems[0] * local_48[2] <= iVar3);
  }
  return;
}

Assistant:

void Grid<T,d>::
Nodes_In_Cell_From_Minimum_Corner_Node(const T_INDEX& minimum_corner_node,T_INDEX nodes[number_of_nodes_per_cell]) const
{
    int node=0;
    for(Range_Iterator<d> iterator(Range<int,d>(T_INDEX(),T_INDEX(1)));iterator.Valid();iterator.Next())
        nodes[node++]=minimum_corner_node+iterator.Index();
}